

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O2

Type * __thiscall
soul::Type::withConstAndRefFlags
          (Type *__return_storage_ptr__,Type *this,bool shouldBeConst,bool shouldBeRef)

{
  Type(__return_storage_ptr__,this);
  __return_storage_ptr__->isConstant = shouldBeConst;
  __return_storage_ptr__->isRef = shouldBeRef;
  return __return_storage_ptr__;
}

Assistant:

Type Type::withConstAndRefFlags (bool shouldBeConst, bool shouldBeRef) const
{
    auto t = *this;
    t.isConstant = shouldBeConst;
    t.isRef = shouldBeRef;
    return t;
}